

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusion.cpp
# Opt level: O1

void __thiscall
RTFusion::calculatePose(RTFusion *this,RTVector3 *accel,RTVector3 *mag,float magDeclination)

{
  RTQuaternion *this_00;
  RTFLOAT *pRVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  float fVar6;
  RTFLOAT RVar7;
  RTQuaternion q;
  RTQuaternion m;
  RTQuaternion local_70;
  RTQuaternion local_60;
  RTQuaternion local_50;
  RTQuaternion local_40;
  RTQuaternion local_30;
  
  RTQuaternion::RTQuaternion(&local_60);
  RTQuaternion::RTQuaternion(&local_70);
  if (this->m_enableAccel == true) {
    RTVector3::accelToEuler(accel,&this->m_measuredPose);
  }
  else {
    RTVector3::operator=(&this->m_measuredPose,&this->m_fusionPose);
    (this->m_measuredPose).m_data[2] = 0.0;
  }
  if ((this->m_enableCompass == true) && (this->m_compassValid == true)) {
    RTQuaternion::fromEuler(&local_70,&this->m_measuredPose);
    local_60.m_data[0] = 0.0;
    local_60.m_data[1] = mag->m_data[0];
    local_60.m_data[2] = mag->m_data[1];
    local_60.m_data[3] = mag->m_data[2];
    local_40 = RTQuaternion::operator*(&local_70,&local_60);
    local_50 = RTQuaternion::conjugate(&local_70);
    local_30 = RTQuaternion::operator*(&local_40,&local_50);
    RTQuaternion::operator=(&local_60,&local_30);
    fVar6 = atan2f(local_60.m_data[2],local_60.m_data[1]);
    RVar7 = -fVar6 - magDeclination;
  }
  else {
    RVar7 = (this->m_fusionPose).m_data[2];
  }
  (this->m_measuredPose).m_data[2] = RVar7;
  this_00 = &this->m_measuredQPose;
  RTQuaternion::fromEuler(this_00,&this->m_measuredPose);
  uVar4 = 0xffffffff;
  fVar6 = -1000.0;
  uVar5 = 0;
  do {
    if (fVar6 < ABS(this_00->m_data[uVar5])) {
      uVar4 = uVar5 & 0xffffffff;
      fVar6 = ABS(this_00->m_data[uVar5]);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  iVar3 = (int)uVar4;
  if (((this_00->m_data[iVar3] < 0.0) && (0.0 < (this->m_fusionQPose).m_data[iVar3])) ||
     ((0.0 < this_00->m_data[iVar3] &&
      (pRVar1 = (this->m_fusionQPose).m_data + iVar3, *pRVar1 <= 0.0 && *pRVar1 != 0.0)))) {
    RVar7 = (this->m_measuredQPose).m_data[1];
    uVar2 = *(undefined8 *)((this->m_measuredQPose).m_data + 2);
    (this->m_measuredQPose).m_data[0] = -(this->m_measuredQPose).m_data[0];
    (this->m_measuredQPose).m_data[1] = -RVar7;
    (this->m_measuredQPose).m_data[2] = -(RTFLOAT)uVar2;
    (this->m_measuredQPose).m_data[3] = -(RTFLOAT)((ulong)uVar2 >> 0x20);
    RTQuaternion::toEuler(this_00,&this->m_measuredPose);
  }
  return;
}

Assistant:

void RTFusion::calculatePose(const RTVector3& accel, const RTVector3& mag, float magDeclination)
{
    RTQuaternion m;
    RTQuaternion q;

    if (m_enableAccel) {
        accel.accelToEuler(m_measuredPose);
    } else {
        m_measuredPose = m_fusionPose;
        m_measuredPose.setZ(0);
    }

    if (m_enableCompass && m_compassValid) {
        q.fromEuler(m_measuredPose);
        m.setScalar(0);
        m.setX(mag.x());
        m.setY(mag.y());
        m.setZ(mag.z());

        m = q * m * q.conjugate();
        m_measuredPose.setZ(-atan2(m.y(), m.x()) - magDeclination);
    } else {
        m_measuredPose.setZ(m_fusionPose.z());
    }

    m_measuredQPose.fromEuler(m_measuredPose);

    //  check for quaternion aliasing. If the quaternion has the wrong sign
    //  the kalman filter will be very unhappy.

    int maxIndex = -1;
    RTFLOAT maxVal = -1000;

    for (int i = 0; i < 4; i++) {
        if (fabs(m_measuredQPose.data(i)) > maxVal) {
            maxVal = fabs(m_measuredQPose.data(i));
            maxIndex = i;
        }
    }

    //  if the biggest component has a different sign in the measured and kalman poses,
    //  change the sign of the measured pose to match.

    if (((m_measuredQPose.data(maxIndex) < 0) && (m_fusionQPose.data(maxIndex) > 0)) ||
            ((m_measuredQPose.data(maxIndex) > 0) && (m_fusionQPose.data(maxIndex) < 0))) {
        m_measuredQPose.setScalar(-m_measuredQPose.scalar());
        m_measuredQPose.setX(-m_measuredQPose.x());
        m_measuredQPose.setY(-m_measuredQPose.y());
        m_measuredQPose.setZ(-m_measuredQPose.z());
        m_measuredQPose.toEuler(m_measuredPose);
    }
}